

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTable
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,Name name,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,
          TableType type,Index pos)

{
  undefined8 *puVar1;
  _Uninitialized<wasm::Table_*,_true> _Var2;
  Name name_00;
  undefined1 local_b0 [8];
  Result<wasm::Table_*> t;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  undefined1 local_60 [8];
  Result<wasm::Ok> _val;
  
  t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._32_8_ = name.super_IString.str._M_len;
  checkImport((Result<wasm::Ok> *)local_60,this,pos,import);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    _Var2._M_storage =
         (Table *)((long)&t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                          super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Table_*,_wasm::Err> + 8);
    local_b0 = (undefined1  [8])_Var2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_60,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if (local_b0 == (undefined1  [8])_Var2._M_storage) {
      *puVar1 = CONCAT71(t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._M_u._9_7_,
                         t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_b0;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._M_u._9_7_,
                    t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._M_u._8_1_);
    }
    ((_Uninitialized<wasm::Table_*,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->_M_storage =
         (Table *)t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._M_u._M_first._M_storage;
    t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._M_u._M_first._M_storage =
         (_Uninitialized<wasm::Table_*,_true>)(Table *)0x0;
    t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    local_b0 = (undefined1  [8])_Var2;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
    name_00.super_IString.str._M_str = name.super_IString.str._M_str;
    name_00.super_IString.str._M_len =
         t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
         super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._32_8_;
    addTableDecl((Result<wasm::Table_*> *)local_b0,this,pos,name_00,import,type);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Table_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Table_*,_wasm::Err> *)local_60,
               (_Copy_ctor_base<false,_wasm::Table_*,_wasm::Err> *)local_b0);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      local_80 = &local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_60,
                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if (local_80 == &local_70) {
        *puVar1 = CONCAT71(uStack_6f,local_70);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_68;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_80;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_6f,local_70);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_78;
      local_78 = 0;
      local_70 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      local_80 = &local_70;
      std::__detail::__variant::_Variant_storage<false,_wasm::Table_*,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Table_*,_wasm::Err> *)local_60);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Table_*,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Table_*,_wasm::Err> *)local_60);
      anon_unknown_2::addExports
                ((Result<wasm::Ok> *)local_60,&this->in,this->wasm,(Named *)local_b0,exports,Table);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_80 = &local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_60,
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_60);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (local_80 == &local_70) {
          *puVar1 = CONCAT71(uStack_6f,local_70);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_68;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_80;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(uStack_6f,local_70);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_78;
        local_78 = 0;
        local_70 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        local_80 = &local_70;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
        local_60 = (undefined1  [8])
                   t.val.super__Variant_base<wasm::Table_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Table_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Table_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Table_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Table_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Table_*,_wasm::Err>._32_8_;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_4_ = pos;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._12_4_ =
             (int)((ulong)((long)(this->tableDefs).
                                 super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->tableDefs).
                                super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._33_7_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = name.super_IString.str._M_str
        ;
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
        emplace_back<wasm::WATParser::DefPos>(&this->tableDefs,(DefPos *)local_60);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ != 0) {
          operator_delete((void *)_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_,
                          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ -
                          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_);
        }
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Table_*,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Table_*,_wasm::Err> *)local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addTable(Name name,
                                 const std::vector<Name>& exports,
                                 ImportNames* import,
                                 TableType type,
                                 Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto t = addTableDecl(pos, name, import, type);
  CHECK_ERR(t);
  CHECK_ERR(addExports(in, wasm, *t, exports, ExternalKind::Table));
  // TODO: table annotations
  tableDefs.push_back({name, pos, Index(tableDefs.size()), {}});
  return Ok{};
}